

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

bool wasm::anon_unknown_0::shapeEq(Type a,Type b)

{
  pointer pTVar1;
  bool bVar2;
  bool bVar3;
  Nullability NVar4;
  Nullability NVar5;
  Tuple *pTVar6;
  Tuple *pTVar7;
  HeapType HVar8;
  ulong uVar9;
  Type local_38;
  Type a_local;
  Type b_local;
  
  bVar2 = true;
  if (a.id != b.id) {
    local_38.id = a.id;
    a_local = b;
    bVar2 = wasm::Type::isTuple(&local_38);
    if ((bVar2) && (bVar2 = wasm::Type::isTuple(&a_local), bVar2)) {
      pTVar6 = wasm::Type::getTuple(&local_38);
      pTVar7 = wasm::Type::getTuple(&a_local);
      if ((long)(pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start ==
          (long)(pTVar7->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pTVar7->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start) {
        pTVar1 = (pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                 .super__Vector_impl_data._M_start;
        bVar2 = (pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish == pTVar1;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = shapeEq((Type)pTVar1->id,
                        (Type)((pTVar7->types).
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_start)->id);
        if (!bVar3) {
          return bVar2;
        }
        uVar9 = 1;
        do {
          pTVar1 = (pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar2 = (ulong)((long)(pTVar6->types).
                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) <= uVar9;
          if (bVar2) {
            return bVar2;
          }
          bVar3 = shapeEq((Type)pTVar1[uVar9].id,
                          (Type)(pTVar7->types).
                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar9].id);
          uVar9 = uVar9 + 1;
        } while (bVar3);
        return bVar2;
      }
    }
    else {
      bVar2 = wasm::Type::isRef(&local_38);
      if ((bVar2) &&
         (((bVar2 = wasm::Type::isRef(&a_local), bVar2 &&
           (HVar8 = wasm::Type::getHeapType(&local_38), 0xd < HVar8.id)) &&
          (HVar8 = wasm::Type::getHeapType(&a_local), 0xd < HVar8.id)))) {
        NVar4 = wasm::Type::getNullability(&local_38);
        NVar5 = wasm::Type::getNullability(&a_local);
        return NVar4 == NVar5;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool shapeEq(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return shapeEq(a.getTuple(), b.getTuple());
  }
  // The only thing allowed to differ is the non-basic heap type child, since we
  // don't know before running the DFA partition refinement whether different
  // heap type children will end up being merged. Children that won't be merged
  // will end up being differentiated by the partition refinement.
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.getHeapType().isBasic() || b.getHeapType().isBasic()) {
    return false;
  }
  if (a.getNullability() != b.getNullability()) {
    return false;
  }
  return true;
}